

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_thread_create(ma_context *pContext,ma_thread *pThread,ma_thread_entry_proc entryProc,
                          void *pData)

{
  void *pData_local;
  ma_thread_entry_proc entryProc_local;
  ma_thread *pThread_local;
  ma_context *pContext_local;
  
  if (((pContext == (ma_context *)0x0) || (pThread == (ma_thread *)0x0)) ||
     (entryProc == (ma_thread_entry_proc)0x0)) {
    pContext_local._4_4_ = 0;
  }
  else {
    pThread->pContext = pContext;
    pContext_local._4_4_ = ma_thread_create__posix(pContext,pThread,entryProc,pData);
  }
  return pContext_local._4_4_;
}

Assistant:

static ma_result ma_thread_create(ma_context* pContext, ma_thread* pThread, ma_thread_entry_proc entryProc, void* pData)
{
    if (pContext == NULL || pThread == NULL || entryProc == NULL) {
        return MA_FALSE;
    }

    pThread->pContext = pContext;

#ifdef MA_WIN32
    return ma_thread_create__win32(pContext, pThread, entryProc, pData);
#endif
#ifdef MA_POSIX
    return ma_thread_create__posix(pContext, pThread, entryProc, pData);
#endif
}